

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_bonsai_trie.hpp
# Opt level: O0

uint64_t __thiscall
poplar::
compact_bonsai_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
::find_child(compact_bonsai_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
             *this,uint64_t node_id,uint64_t symb)

{
  bool bVar1;
  type_conflict *ptVar2;
  type_conflict *ptVar3;
  compact_bonsai_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
  *pcVar4;
  uint64_t uVar5;
  compact_bonsai_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
  *this_00;
  compact_bonsai_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
  *in_RDI;
  uint64_t cnt;
  uint64_t i;
  type_conflict *mod;
  type_conflict *quo;
  uint64_t in_stack_ffffffffffffff98;
  split_mix_hasher *in_stack_ffffffffffffffa0;
  compact_bonsai_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
  *in_stack_ffffffffffffffb0;
  uint64_t slot_id;
  uint64_t in_stack_ffffffffffffffb8;
  compact_bonsai_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
  *this_01;
  compact_bonsai_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
  *in_stack_ffffffffffffffc0;
  
  if (in_RDI->size_ == 0) {
    return 0xffffffffffffffff;
  }
  make_key_(in_stack_ffffffffffffffb0,(uint64_t)in_RDI,(uint64_t)in_stack_ffffffffffffffa0);
  bijective_hash::split_mix_hasher::hash(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  decompose_(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  ptVar2 = std::get<0ul,unsigned_long,unsigned_long>((pair<unsigned_long,_unsigned_long> *)0x214627)
  ;
  ptVar3 = std::get<1ul,unsigned_long,unsigned_long>((pair<unsigned_long,_unsigned_long> *)0x214636)
  ;
  this_00 = (compact_bonsai_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
             *)*ptVar3;
  slot_id = 1;
  do {
    this_01 = this_00;
    pcVar4 = (compact_bonsai_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
              *)get_root(in_RDI);
    if (this_00 != pcVar4) {
      bVar1 = compare_dsp_(this_01,slot_id,(uint64_t)in_RDI);
      if (bVar1) {
        return 0xffffffffffffffff;
      }
      bVar1 = compare_dsp_(this_01,slot_id,(uint64_t)in_RDI);
      if (bVar1) {
        in_stack_ffffffffffffff98 = *ptVar2;
        uVar5 = get_quo_(this_00,in_stack_ffffffffffffff98);
        if (in_stack_ffffffffffffff98 == uVar5) {
          return (uint64_t)this_01;
        }
      }
    }
    this_00 = (compact_bonsai_trie<90U,_4U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
               *)right_(this_00,in_stack_ffffffffffffff98);
    slot_id = slot_id + 1;
  } while( true );
}

Assistant:

uint64_t find_child(uint64_t node_id, uint64_t symb) const {
        assert(node_id < capa_size_.size());
        assert(symb < symb_size_.size());

        if (size_ == 0) {
            return nil_id;
        }

        auto [quo, mod] = decompose_(hasher_.hash(make_key_(node_id, symb)));

        for (uint64_t i = mod, cnt = 1;; i = right_(i), ++cnt) {
            if (i == get_root()) {
                // because the root's dsp value is zero though it is defined
                continue;
            }

            if (compare_dsp_(i, 0)) {
                // this slot is empty
                return nil_id;
            }

            if (compare_dsp_(i, cnt) and quo == get_quo_(i)) {
                return i;
            }
        }
    }